

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::RenderNavHighlight(ImRect *bb,ImGuiID id,ImGuiNavHighlightFlags flags)

{
  ImGuiWindow *pIVar1;
  ImDrawList *pIVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  ImU32 IVar12;
  undefined4 unaff_R12D;
  int iVar13;
  float local_6c;
  ImVec2 local_68;
  ImVec2 aIStack_60 [2];
  ImVec2 local_50;
  ImVec4 local_48;
  ImVec2 local_38;
  
  if ((GImGui->NavId == id) &&
     ((((flags & 4U) != 0 || (GImGui->NavDisableHighlight == false)) &&
      (pIVar1 = GImGui->CurrentWindow, (pIVar1->DC).NavHideHighlightOneFrame == false)))) {
    local_6c = 0.0;
    if ((flags & 8U) == 0) {
      local_6c = (GImGui->Style).FrameRounding;
    }
    local_68.x = (bb->Min).x;
    local_68.y = (bb->Min).y;
    aIStack_60[0].x = (bb->Max).x;
    aIStack_60[0].y = (bb->Max).y;
    fVar4 = (pIVar1->ClipRect).Min.x;
    fVar5 = (pIVar1->ClipRect).Min.y;
    fVar6 = (pIVar1->ClipRect).Max.x;
    fVar7 = (pIVar1->ClipRect).Max.y;
    local_68.x = (float)(~-(uint)(fVar4 <= local_68.x) & (uint)fVar4 |
                        (uint)local_68.x & -(uint)(fVar4 <= local_68.x));
    local_68.y = (float)(~-(uint)(fVar5 <= local_68.y) & (uint)fVar5 |
                        (uint)local_68.y & -(uint)(fVar5 <= local_68.y));
    aIStack_60[0].x =
         (float)(~-(uint)(aIStack_60[0].x < fVar6) & (uint)fVar6 |
                (uint)aIStack_60[0].x & -(uint)(aIStack_60[0].x < fVar6));
    aIStack_60[0].y =
         (float)(~-(uint)(aIStack_60[0].y < fVar7) & (uint)fVar7 |
                (uint)aIStack_60[0].y & -(uint)(aIStack_60[0].y < fVar7));
    if ((flags & 1U) != 0) {
      local_68.x = local_68.x + -4.0;
      local_68.y = local_68.y + -4.0;
      aIStack_60[0].x = aIStack_60[0].x + 4.0;
      aIStack_60[0].y = aIStack_60[0].y + 4.0;
      auVar3._4_4_ = -(uint)(aIStack_60[0].y <= fVar7);
      auVar3._0_4_ = -(uint)(aIStack_60[0].x <= fVar6);
      auVar3._8_4_ = -(uint)(fVar4 <= local_68.x);
      auVar3._12_4_ = -(uint)(fVar5 <= local_68.y);
      iVar13 = movmskps(unaff_R12D,auVar3);
      if (iVar13 != 0xf) {
        ImDrawList::PushClipRect(pIVar1->DrawList,&local_68,aIStack_60,false);
      }
      pIVar2 = pIVar1->DrawList;
      local_50.y = local_68.y + 1.0;
      local_50.x = local_68.x + 1.0;
      local_38.x = aIStack_60[0].x + -1.0;
      local_38.y = aIStack_60[0].y + -1.0;
      local_48.x = (GImGui->Style).Colors[0x31].x;
      local_48.y = (GImGui->Style).Colors[0x31].y;
      uVar8 = (GImGui->Style).Colors[0x31].z;
      uVar9 = (GImGui->Style).Colors[0x31].w;
      local_48.w = (GImGui->Style).Alpha * (float)uVar9;
      local_48.z = (float)uVar8;
      IVar12 = ColorConvertFloat4ToU32(&local_48);
      ImDrawList::AddRect(pIVar2,&local_50,&local_38,IVar12,local_6c,0,2.0);
      if ((char)iVar13 != '\x0f') {
        ImDrawList::PopClipRect(pIVar1->DrawList);
      }
    }
    if ((flags & 2U) != 0) {
      pIVar2 = pIVar1->DrawList;
      local_48.x = (GImGui->Style).Colors[0x31].x;
      local_48.y = (GImGui->Style).Colors[0x31].y;
      uVar10 = (GImGui->Style).Colors[0x31].z;
      uVar11 = (GImGui->Style).Colors[0x31].w;
      local_48.w = (GImGui->Style).Alpha * (float)uVar11;
      local_48.z = (float)uVar10;
      IVar12 = ColorConvertFloat4ToU32(&local_48);
      ImDrawList::AddRect(pIVar2,&local_68,aIStack_60,IVar12,local_6c,0,1.0);
    }
  }
  return;
}

Assistant:

void ImGui::RenderNavHighlight(const ImRect& bb, ImGuiID id, ImGuiNavHighlightFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (id != g.NavId)
        return;
    if (g.NavDisableHighlight && !(flags & ImGuiNavHighlightFlags_AlwaysDraw))
        return;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->DC.NavHideHighlightOneFrame)
        return;

    float rounding = (flags & ImGuiNavHighlightFlags_NoRounding) ? 0.0f : g.Style.FrameRounding;
    ImRect display_rect = bb;
    display_rect.ClipWith(window->ClipRect);
    if (flags & ImGuiNavHighlightFlags_TypeDefault)
    {
        const float THICKNESS = 2.0f;
        const float DISTANCE = 3.0f + THICKNESS * 0.5f;
        display_rect.Expand(ImVec2(DISTANCE, DISTANCE));
        bool fully_visible = window->ClipRect.Contains(display_rect);
        if (!fully_visible)
            window->DrawList->PushClipRect(display_rect.Min, display_rect.Max);
        window->DrawList->AddRect(display_rect.Min + ImVec2(THICKNESS * 0.5f, THICKNESS * 0.5f), display_rect.Max - ImVec2(THICKNESS * 0.5f, THICKNESS * 0.5f), GetColorU32(ImGuiCol_NavHighlight), rounding, 0, THICKNESS);
        if (!fully_visible)
            window->DrawList->PopClipRect();
    }
    if (flags & ImGuiNavHighlightFlags_TypeThin)
    {
        window->DrawList->AddRect(display_rect.Min, display_rect.Max, GetColorU32(ImGuiCol_NavHighlight), rounding, 0, 1.0f);
    }
}